

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

void curl_mime_free(curl_mime *mime)

{
  curl_mimepart *part_00;
  curl_mimepart *part;
  curl_mime *mime_local;
  
  if (mime != (curl_mime *)0x0) {
    mime_subparts_unbind(mime);
    while (mime->firstpart != (curl_mimepart *)0x0) {
      part_00 = mime->firstpart;
      mime->firstpart = part_00->nextpart;
      Curl_mime_cleanpart(part_00);
      (*Curl_cfree)(part_00);
    }
    (*Curl_cfree)(mime->boundary);
    (*Curl_cfree)(mime);
  }
  return;
}

Assistant:

void curl_mime_free(curl_mime *mime)
{
  curl_mimepart *part;

  if(mime) {
    mime_subparts_unbind(mime);  /* Be sure it's not referenced anymore. */
    while(mime->firstpart) {
      part = mime->firstpart;
      mime->firstpart = part->nextpart;
      Curl_mime_cleanpart(part);
      free(part);
    }

    free(mime->boundary);
    free(mime);
  }
}